

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

int64_t duckdb::DateDiff::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                  (timestamp_t startdate,timestamp_t enddate)

{
  date_t startdate_00;
  date_t enddate_00;
  long lVar1;
  
  startdate_00 = Timestamp::GetDate(startdate);
  enddate_00 = Timestamp::GetDate(enddate);
  lVar1 = Operation<duckdb::date_t,duckdb::date_t,long>(startdate_00,enddate_00);
  return lVar1;
}

Assistant:

int64_t DateDiff::MonthOperator::Operation(timestamp_t startdate, timestamp_t enddate) {
	return MonthOperator::Operation<date_t, date_t, int64_t>(Timestamp::GetDate(startdate),
	                                                         Timestamp::GetDate(enddate));
}